

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case0909(DeclarationBinderTester *this)

{
  socklen_t in_ECX;
  allocator<char> local_e1;
  string local_e0 [32];
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"void x ( ) ( ) ;",&local_e1);
  Expectation::Expectation(&local_c0);
  bind(this,(int)local_e0,(sockaddr *)&local_c0,in_ECX);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string(local_e0);
  return;
}

Assistant:

void DeclarationBinderTester::case0909()
{
    CROSS_REFERENCE_TEST(ParserTester::case0205);

    // Function returning a function.

    bind("void x ( ) ( ) ;");
}